

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

void __thiscall
ModListIRCCommand::trigger
          (ModListIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pMVar3;
  size_type sVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
  *this_00;
  Config *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_type sVar7;
  undefined1 auVar8 [16];
  __sv_type _Var9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t local_198;
  char *local_190;
  size_t local_178;
  char *local_170;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  size_t local_d0;
  reference local_c8;
  value_type *section;
  const_iterator __end2;
  const_iterator __begin2;
  SectionHashTable *__range2;
  _Self local_78;
  _Self local_70;
  iterator node;
  bool haveMods;
  size_t msgBaseSize;
  string msg;
  IRC_Bot *source_local;
  ModListIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  msg.field_2._8_8_ = source;
  std::__cxx11::string::string((string *)&msgBaseSize);
  node._M_node._7_1_ = 0;
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::begin
                 (&pluginInstance.groups);
  while( true ) {
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::end
                   (&pluginInstance.groups);
    bVar2 = std::operator==(&local_70,&local_78);
    uVar1 = msg.field_2._8_8_;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pMVar3 = std::_List_iterator<RenX_ModSystemPlugin::ModGroup>::operator->(&local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgBaseSize,
               &pMVar3->prefix);
    pMVar3 = std::_List_iterator<RenX_ModSystemPlugin::ModGroup>::operator->(&local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgBaseSize,
               &pMVar3->name);
    pMVar3 = std::_List_iterator<RenX_ModSystemPlugin::ModGroup>::operator->(&local_70);
    string_printf_abi_cxx11_((string *)&__range2,"\x0f (Access: %d): ",(ulong)(uint)pMVar3->access);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgBaseSize,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &msgBaseSize);
    Jupiter::Plugin::getConfig();
    this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
               *)Jupiter::Config::getSections_abi_cxx11_();
    __end2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
             ::begin(this_00);
    section = (value_type *)
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
              ::end(this_00);
    while (bVar2 = std::__detail::operator==
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                                *)&section), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_c8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>
                 ::operator*(&__end2);
      pCVar5 = &local_c8->second;
      local_e8 = sv("Group",5);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8);
      auVar8 = Jupiter::Config::get
                         (pCVar5,local_e8._M_len,local_e8._M_str,local_f8._M_len,local_f8._M_str);
      local_d0 = auVar8._8_8_;
      pbVar6 = auVar8._0_8_;
      local_d8 = pbVar6;
      pMVar3 = std::_List_iterator<RenX_ModSystemPlugin::ModGroup>::operator->(&local_70);
      bVar10._M_str = &pMVar3->name;
      bVar10._M_len = local_d0;
      bVar2 = jessilib::equalsi<char,char>((jessilib *)local_d8,bVar10,pbVar6);
      if (bVar2) {
        pCVar5 = &local_c8->second;
        local_128 = sv("Name",4);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Jupiter::Config::getName_abi_cxx11_();
        std::__cxx11::string::string((string *)&local_148,pbVar6);
        Jupiter::Config::get<std::__cxx11::string>(&local_118,pCVar5,local_128,&local_148);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgBaseSize
                   ,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_148);
        local_158 = sv(", ",2);
        std::__cxx11::string::operator+=((string *)&msgBaseSize,&local_158);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>
      ::operator++(&__end2);
    }
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &msgBaseSize);
    if (sVar7 != sVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgBaseSize);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgBaseSize);
      uVar1 = msg.field_2._8_8_;
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&msgBaseSize);
      local_178 = _Var9._M_len;
      local_170 = _Var9._M_str;
      Jupiter::IRC::Client::sendMessage(uVar1,channel._M_len,channel._M_str,local_178,local_170);
      node._M_node._7_1_ = 1;
    }
    std::_List_iterator<RenX_ModSystemPlugin::ModGroup>::operator++(&local_70);
  }
  if ((node._M_node._7_1_ & 1) == 0) {
    bVar10 = sv("There are no configured moderators.",0x23);
    local_198 = bVar10._M_len;
    local_190 = bVar10._M_str;
    Jupiter::IRC::Client::sendMessage(uVar1,channel._M_len,channel._M_str,local_198,local_190);
  }
  std::__cxx11::string::~string((string *)&msgBaseSize);
  return;
}

Assistant:

void ModListIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	std::string msg;
	size_t msgBaseSize;
	bool haveMods = false;
	for (auto node = pluginInstance.groups.begin(); node != pluginInstance.groups.end(); ++node) {
		msg = node->prefix;
		msg += node->name;
		msg += string_printf(IRCNORMAL " (Access: %d): ", node->access);
		msgBaseSize = msg.size();

		for (auto& section : pluginInstance.getConfig().getSections()) {
			if (jessilib::equalsi(section.second.get("Group"sv), node->name)) {
				msg += section.second.get("Name"sv, section.second.getName());
				msg += ", "sv;
			}
		}

		if (msg.size() != msgBaseSize) {
			msg.pop_back(); // ' '
			msg.pop_back(); // ','
			source->sendMessage(channel, msg);
			haveMods = true;
		}
	}
	if (!haveMods)
		source->sendMessage(channel, "There are no configured moderators."sv);
}